

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool arena_decay_impl(tsdn_t *tsdn,arena_t *arena,decay_t *decay,pac_decay_stats_t *decay_stats,
                      ecache_t *ecache,_Bool is_background_thread,_Bool all)

{
  byte bVar1;
  byte bVar2;
  pac_purge_eagerness_t pVar3;
  byte fully_decay;
  pac_decay_stats_t *in_RCX;
  decay_t *in_RDX;
  pac_t *in_RSI;
  pac_decay_stats_t *in_RDI;
  ecache_t *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  size_t npages_new;
  _Bool epoch_advanced;
  pac_purge_eagerness_t eagerness;
  _Bool result;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  malloc_mutex_t *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffbc;
  pac_decay_stats_t *decay_stats_00;
  undefined2 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffea;
  _Bool _Var4;
  undefined1 in_stack_ffffffffffffffeb;
  undefined4 in_stack_ffffffffffffffec;
  pac_t *in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  fully_decay = in_R9B & 1;
  bVar1 = in_stack_00000008 & 1;
  if (bVar1 == 0) {
    _Var4 = malloc_mutex_trylock
                      ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (malloc_mutex_t *)0x24c1c91);
    if (_Var4) {
      _Var4 = true;
    }
    else {
      pVar3 = arena_decide_unforced_purge_eagerness((_Bool)(fully_decay & 1));
      bVar2 = duckdb_je_pac_maybe_decay_purge
                        ((tsdn_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_stack_fffffffffffffff0,
                         (decay_t *)
                         CONCAT44(in_stack_ffffffffffffffec,
                                  CONCAT13(in_stack_ffffffffffffffeb,
                                           CONCAT12(in_stack_ffffffffffffffea,
                                                    in_stack_ffffffffffffffe8))),in_RDI,
                         (ecache_t *)in_RSI,(pac_purge_eagerness_t)((ulong)in_RDX >> 0x20));
      if ((bool)bVar2) {
        in_stack_ffffffffffffffa8 = decay_epoch_npages_delta(in_RDX);
      }
      malloc_mutex_unlock((tsdn_t *)in_RCX,in_stack_ffffffffffffff88);
      if ((((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) && ((bVar2 & 1) != 0)) &&
         ((fully_decay & 1) == 0)) {
        arena_maybe_do_deferred_work
                  ((tsdn_t *)in_R8,
                   (arena_t *)
                   CONCAT17(fully_decay,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffbc,pVar3))),
                   (decay_t *)CONCAT17(bVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
      }
      _Var4 = false;
    }
  }
  else {
    decay_stats_00 = in_RCX;
    malloc_mutex_lock((tsdn_t *)in_RDX,(malloc_mutex_t *)in_RCX);
    duckdb_je_pac_decay_all((tsdn_t *)in_RDI,in_RSI,in_RDX,decay_stats_00,in_R8,(_Bool)fully_decay);
    malloc_mutex_unlock((tsdn_t *)in_RCX,in_stack_ffffffffffffff88);
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

static bool
arena_decay_impl(tsdn_t *tsdn, arena_t *arena, decay_t *decay,
    pac_decay_stats_t *decay_stats, ecache_t *ecache,
    bool is_background_thread, bool all) {
	if (all) {
		malloc_mutex_lock(tsdn, &decay->mtx);
		pac_decay_all(tsdn, &arena->pa_shard.pac, decay, decay_stats,
		    ecache, /* fully_decay */ all);
		malloc_mutex_unlock(tsdn, &decay->mtx);
		return false;
	}

	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* No need to wait if another thread is in progress. */
		return true;
	}
	pac_purge_eagerness_t eagerness =
	    arena_decide_unforced_purge_eagerness(is_background_thread);
	bool epoch_advanced = pac_maybe_decay_purge(tsdn, &arena->pa_shard.pac,
	    decay, decay_stats, ecache, eagerness);
	size_t npages_new;
	if (epoch_advanced) {
		/* Backlog is updated on epoch advance. */
		npages_new = decay_epoch_npages_delta(decay);
	}
	malloc_mutex_unlock(tsdn, &decay->mtx);

	if (have_background_thread && background_thread_enabled() &&
	    epoch_advanced && !is_background_thread) {
		arena_maybe_do_deferred_work(tsdn, arena, decay, npages_new);
	}

	return false;
}